

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-curse.c
# Opt level: O2

int16_t modify_weight_for_curse(wchar_t i,int16_t weight)

{
  object *poVar1;
  _Bool _Var2;
  short sVar3;
  ushort uVar4;
  uint uVar5;
  ushort uVar6;
  
  if ((L'\xffffffff' < i) && ((uint)i < (uint)z_info->curse_max)) {
    poVar1 = curses[(uint)i].obj;
    _Var2 = flag_has_dbg(poVar1->flags,6,0x2c,"curse_obj->flags","OF_MULTIPLY_WEIGHT");
    if (_Var2) {
      uVar6 = poVar1->weight;
      if ((short)uVar6 < 0) {
        __assert_fail("curse_obj->weight >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-curse.c"
                      ,0x193,"int16_t modify_weight_for_curse(int, int16_t)");
      }
      if (uVar6 < 0x65) {
        uVar4 = 0;
        if (0 < weight) {
          uVar4 = weight;
        }
      }
      else {
        uVar4 = 1;
        if (1 < weight) {
          uVar4 = weight;
        }
      }
      uVar5 = (uint)uVar4 * (int)(short)uVar6;
      sVar3 = 0x7fff;
      if (uVar5 < 0x31ff9c) {
        sVar3 = ((short)((ulong)uVar5 / 100) + 1) - (ushort)(uVar5 % 100 < 0x32);
      }
    }
    else {
      uVar6 = 0;
      if (0 < weight) {
        uVar6 = weight;
      }
      uVar4 = poVar1->weight;
      if ((short)uVar4 < 0) {
        sVar3 = 0;
        if (0 < (short)(uVar4 + uVar6)) {
          sVar3 = uVar4 + uVar6;
        }
      }
      else {
        sVar3 = uVar6 + uVar4;
        if ((uVar4 ^ 0x7fff) <= uVar6) {
          sVar3 = 0x7fff;
        }
      }
    }
    return sVar3;
  }
  __assert_fail("i >= 0 && i < z_info->curse_max",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-curse.c"
                ,0x186,"int16_t modify_weight_for_curse(int, int16_t)");
}

Assistant:

int16_t modify_weight_for_curse(int i, int16_t weight)
{
	const struct object *curse_obj;
	int16_t result;

	assert(i >= 0 && i < z_info->curse_max);
	curse_obj = curses[i].obj;

	if (of_has(curse_obj->flags, OF_MULTIPLY_WEIGHT)) {
		/*
		 * Apply a multiplicative factor of curse_obj->weight over 100
		 * and round to the nearest integer.  Coerce the incoming weight
		 * to be at least one if the multiplicative factor is greater
		 * than one.  That allows multiplicative factors to be of some
		 * use with otherwise weightless items.
		 */
		int32_t scaled, q;

		assert(curse_obj->weight >= 0);
		if (curse_obj->weight > 100) {
			scaled = MAX(weight, 1);
		} else {
			scaled = MAX(weight, 0);
		}
		scaled *= curse_obj->weight;
		q = scaled / 100;
		if (q < 32767) {
			result = q;
			if (scaled % 100 >= 50) {
				++result;
			}
		} else {
			result = 32767;
		}
	} else {
		weight = MAX(0, weight);
		if (curse_obj->weight < 0) {
			result = weight + curse_obj->weight;
			if (result < 0) {
				result = 0;
			}
		} else {
			result = (weight < 32767 - curse_obj->weight) ?
				weight + curse_obj->weight : 32767;
		}
	}

	return result;
}